

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_fill_circle(nk_command_buffer *b,nk_rect r,nk_color c)

{
  float fVar1;
  void *pvVar2;
  float fVar3;
  float fVar7;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float fVar8;
  float fVar9;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  float fStack_20;
  float fStack_1c;
  
  fVar8 = r.w;
  fVar9 = r.h;
  if (b == (nk_command_buffer *)0x0) {
    __assert_fail("b",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x1d42,
                  "void nk_fill_circle(struct nk_command_buffer *, struct nk_rect, struct nk_color)"
                 );
  }
  if ((uint)c < 0x1000000) {
    return;
  }
  if ((fVar8 == 0.0) && (!NAN(fVar8))) {
    return;
  }
  if ((fVar9 == 0.0) && (!NAN(fVar9))) {
    return;
  }
  fVar3 = r.x;
  fVar7 = r.y;
  if (b->use_clipping != 0) {
    fVar1 = (b->clip).x;
    if (fVar3 + fVar8 < fVar1) {
      return;
    }
    if (fVar1 + (b->clip).w < fVar3) {
      return;
    }
    fVar8 = (b->clip).y;
    if (fVar9 + fVar7 < fVar8) {
      return;
    }
    if (fVar8 + (b->clip).h < fVar7) {
      return;
    }
  }
  auVar5._8_4_ = in_XMM1_Dc;
  auVar5._0_8_ = r._8_8_;
  auVar5._12_4_ = in_XMM1_Dd;
  pvVar2 = nk_command_buffer_push(b,NK_COMMAND_CIRCLE_FILLED,0x20);
  fStack_20 = r.x;
  fStack_1c = r.y;
  if (pvVar2 != (void *)0x0) {
    auVar4._0_4_ = (int)fVar3;
    auVar4._4_4_ = (int)fVar7;
    auVar4._8_4_ = (int)fStack_20;
    auVar4._12_4_ = (int)fStack_1c;
    auVar4 = pshuflw(auVar4,auVar4,0xe8);
    *(int *)((long)pvVar2 + 0x10) = auVar4._0_4_;
    auVar5 = maxps((undefined1  [16])0x0,auVar5);
    auVar6._0_4_ = (int)auVar5._0_4_;
    auVar6._4_4_ = (int)auVar5._4_4_;
    auVar6._8_4_ = (int)auVar5._8_4_;
    auVar6._12_4_ = (int)auVar5._12_4_;
    auVar5 = pshuflw(auVar6,auVar6,0xe8);
    *(int *)((long)pvVar2 + 0x14) = auVar5._0_4_;
    *(short *)((long)pvVar2 + 0x18) = c._0_2_;
    *(nk_byte *)((long)pvVar2 + 0x1a) = c.b;
    *(nk_byte *)((long)pvVar2 + 0x1b) = c.a;
  }
  return;
}

Assistant:

NK_API void
nk_fill_circle(struct nk_command_buffer *b, struct nk_rect r, struct nk_color c)
{
    struct nk_command_circle_filled *cmd;
    NK_ASSERT(b);
    if (!b || c.a == 0 || r.w == 0 || r.h == 0) return;
    if (b->use_clipping) {
        const struct nk_rect *clip = &b->clip;
        if (!NK_INTERSECT(r.x, r.y, r.w, r.h, clip->x, clip->y, clip->w, clip->h))
            return;
    }

    cmd = (struct nk_command_circle_filled*)
        nk_command_buffer_push(b, NK_COMMAND_CIRCLE_FILLED, sizeof(*cmd));
    if (!cmd) return;
    cmd->x = (short)r.x;
    cmd->y = (short)r.y;
    cmd->w = (unsigned short)NK_MAX(r.w, 0);
    cmd->h = (unsigned short)NK_MAX(r.h, 0);
    cmd->color = c;
}